

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TProcesses::addArgument(TProcesses *this,int arg)

{
  reference pvVar1;
  undefined1 local_38 [8];
  string argString;
  int arg_local;
  TProcesses *this_local;
  
  argString.field_2._12_4_ = arg;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(&this->processes);
  std::__cxx11::string::append((char *)pvVar1);
  std::__cxx11::to_string((string *)local_38,argString.field_2._12_4_);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(&this->processes);
  std::__cxx11::string::append((string *)pvVar1);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void addArgument(int arg)
    {
        processes.back().append(" ");
        std::string argString = std::to_string(arg);
        processes.back().append(argString);
    }